

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_not_equals_different_Test::TestBody
          (ByteBufferTest_test_not_equals_different_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ByteBuffer b;
  ByteBuffer a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  ByteBuffer local_68 [48];
  ByteBuffer local_38 [48];
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,2);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_38);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_38);
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_68,2);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_68);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_68);
  testing::internal::
  CmpHelperNE<bidfx_public_api::tools::ByteBuffer,bidfx_public_api::tools::ByteBuffer>
            (local_78,"a","b",local_38,local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xfa,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_not_equals_different)
{
    ByteBuffer a(2);
    a.WriteByte(2);
    a.WriteByte(3);
    ByteBuffer b(2);
    b.WriteByte(2);
    b.WriteByte(6);
    EXPECT_NE(a, b);
}